

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fra.h
# Opt level: O1

int Fra_ClausSmlNodesAreImp(Fra_Sml_t *pSeq,Aig_Obj_t *pObj1,Aig_Obj_t *pObj2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = pSeq->nWordsTotal;
  iVar2 = pSeq->nWordsPref;
  if (iVar2 < iVar1) {
    lVar3 = 0;
    do {
      if ((*(uint *)((long)&pSeq[1].pAig +
                    lVar3 * 4 + (long)(pObj1->Id * iVar1) * 4 + (long)iVar2 * 4) &
          ~*(uint *)((long)&pSeq[1].pAig +
                    lVar3 * 4 + (long)(pObj2->Id * iVar1) * 4 + (long)iVar2 * 4)) != 0) {
        return 0;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 - iVar2 != (int)lVar3);
  }
  return 1;
}

Assistant:

static inline unsigned *   Fra_ObjSim( Fra_Sml_t * p, int Id )                           { return p->pData + p->nWordsTotal * Id; }